

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O3

void __thiscall NJamSpell::TPerfectHash::Dump(TPerfectHash *this,ostream *out)

{
  void *pvVar1;
  
  pvVar1 = this->Phf;
  std::ostream::write((char *)out,(long)pvVar1 + 0x20);
  std::ostream::write((char *)out,(long)pvVar1 + 0x28);
  std::ostream::write((char *)out,(long)pvVar1 + 0x10);
  std::ostream::write((char *)out,(long)pvVar1 + 8);
  std::ostream::write((char *)out,(long)pvVar1 + 4);
  std::ostream::write((char *)out,(long)pvVar1);
  std::ostream::write((char *)out,*(long *)((long)pvVar1 + 0x18));
  return;
}

Assistant:

void TPerfectHash::Dump(std::ostream& out) const {
    const phf& perfHash = *(const phf*)Phf;
    NHandyPack::Dump(out, perfHash.d_max,
                         perfHash.g_op,
                         perfHash.m,
                         perfHash.r,
                         perfHash.seed,
                         perfHash.nodiv);
    out.write((const char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}